

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

int ** clone_matrix<int>(int **matrix,int row,int col)

{
  int *piVar1;
  int *piVar2;
  int **ppiVar3;
  ulong uVar4;
  ulong uVar5;
  
  ppiVar3 = new_matrix<int>(row,col);
  if (0 < row) {
    uVar4 = 0;
    do {
      if (0 < col) {
        piVar1 = matrix[uVar4];
        piVar2 = ppiVar3[uVar4];
        uVar5 = 0;
        do {
          piVar2[uVar5] = piVar1[uVar5];
          uVar5 = uVar5 + 1;
        } while ((uint)col != uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)row);
  }
  return ppiVar3;
}

Assistant:

T** clone_matrix(T** matrix, int row, int col)
{
    T** ret_val = new_matrix<T>(row, col);

    for (int i = 0; i < row; ++i) {
        for (int j = 0; j < col; ++j) {
            ret_val[i][j] = matrix[i][j];
        }
    }

    return ret_val;
}